

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O0

char * get_align_hyp(ps_decoder_t *ps,int *out_score)

{
  char *pcVar1;
  size_t sVar2;
  undefined1 *puVar3;
  int local_3c;
  ps_decoder_t *ppStack_38;
  int len;
  char *ptr;
  char *out;
  ps_seg_t *itor;
  int *out_score_local;
  ps_decoder_t *ps_local;
  
  pcVar1 = ps_get_hyp(ps,out_score);
  if (pcVar1 == (char *)0x0) {
    ps_local = (ps_decoder_t *)
               __ckd_salloc__("",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                              ,0x291);
  }
  else {
    local_3c = 0;
    for (out = (char *)ps_seg_iter(ps); out != (char *)0x0;
        out = (char *)ps_seg_next((ps_seg_t *)out)) {
      if (-1 < *(int *)(out + 0x20)) {
        sVar2 = strlen(*(char **)(out + 0x10));
        local_3c = local_3c + (int)sVar2 + 1;
      }
    }
    if (local_3c == 0) {
      ps_local = (ps_decoder_t *)
                 __ckd_salloc__("",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                ,0x29b);
    }
    else {
      ps_local = (ps_decoder_t *)
                 __ckd_malloc__((long)local_3c,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                ,0x29c);
      out = (char *)ps_seg_iter(ps);
      ppStack_38 = ps_local;
      for (; out != (char *)0x0; out = (char *)ps_seg_next((ps_seg_t *)out)) {
        if (-1 < *(int *)(out + 0x20)) {
          sVar2 = strlen(*(char **)(out + 0x10));
          memcpy(ppStack_38,*(void **)(out + 0x10),(long)(int)sVar2);
          puVar3 = (undefined1 *)((long)&ppStack_38->config + (long)(int)sVar2);
          ppStack_38 = (ps_decoder_t *)(puVar3 + 1);
          *puVar3 = 0x20;
        }
      }
      *(undefined1 *)((long)&ppStack_38[-1].senlogdir + 7) = 0;
    }
  }
  return (char *)ps_local;
}

Assistant:

static char *
get_align_hyp(ps_decoder_t *ps, int *out_score)
{
    ps_seg_t *itor;
    char *out, *ptr;
    int len;
    
    if (ps_get_hyp(ps, out_score) == NULL)
        return ckd_salloc("");
    len = 0;
    for (itor = ps_seg_iter(ps); itor; itor = ps_seg_next(itor)) {
        /* FIXME: Need to handle tag transitions somehow... */
        if (itor->wid < 0)
            continue;
        len += strlen(itor->text);
        len++;
    }
    if (len == 0)
        return ckd_salloc("");
    ptr = out = ckd_malloc(len);
    for (itor = ps_seg_iter(ps); itor; itor = ps_seg_next(itor)) {
        if (itor->wid < 0)
            continue;
        len = strlen(itor->text);
        memcpy(ptr, itor->text, len);
        ptr += len;
        *ptr++ = ' ';
    }
    *--ptr = '\0';
    return out;
}